

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuumEnergyAngle.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::~ContinuumEnergyAngle
          (ContinuumEnergyAngle *this)

{
  pointer plVar1;
  
  std::
  vector<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
  ::~vector(&(this->data_).sequence_);
  plVar1 = (this->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)*(pointer *)
                                  ((long)&(this->data_).interpolation_.super_InterpolationBase.
                                          interpolationSchemeIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar1);
  }
  plVar1 = (this->data_).interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)*(pointer *)
                                  ((long)&(this->data_).interpolation_.super_InterpolationBase.
                                          boundaryIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar1);
    return;
  }
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT ContinuumEnergyAngle {

public:

  #include "ENDFtk/section/6/ContinuumEnergyAngle/Base.hpp"
  #include "ENDFtk/section/6/ContinuumEnergyAngle/ThermalScatteringData.hpp"
  #include "ENDFtk/section/6/ContinuumEnergyAngle/LegendreCoefficients.hpp"
  #include "ENDFtk/section/6/ContinuumEnergyAngle/KalbachMann.hpp"
  #include "ENDFtk/section/6/ContinuumEnergyAngle/TabulatedDistribution.hpp"

  using Variant = std::variant< LegendreCoefficients,    // LANG=1
                                KalbachMann,             // LANG=2
                                ThermalScatteringData,   // LANG=3
                                TabulatedDistribution >; // LANG=11-15

private:

  /* fields */
  InterpolationSequenceRecord< Variant > data_;

  /* auxiliary functions */
  #include "ENDFtk/section/6/ContinuumEnergyAngle/src/readSequence.hpp"
  #include "ENDFtk/section/6/ContinuumEnergyAngle/src/verifyLANG.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/6/ContinuumEnergyAngle/src/ctor.hpp"

  /* methods */

  /**
   *  @brief Return the LAW flag
   */
  static constexpr int LAW() { return 1; }

  /**
   *  @brief Return the LANG flag for the data representation type
   */
  int LANG() const { return this->data_.tab2().L1(); }

  /**
   *  @brief Return the interpolation scheme for secondary energies
   */
  int LEP() const { return this->data_.tab2().L2(); }

  /**
   *  @brief Return the interpolation scheme for secondary energies
   */
  int interpolationScheme() const { return this->LEP(); }

  /**
   *  @brief Return the number of interpolation ranges on the incident
   *         energy axis
   */
  long NR() const { return this->data_.tab2().NR(); }

  /**
   *  @brief Return the number of interpolation ranges on the incident
   *         energy axis
   */
  long numberInterpolationRegions() const { return this->NR(); }

  /**
   *  @brief Return the number of incident energy values
   */
  long NE() const { return this->data_.tab2().NZ(); }

  /**
   *  @brief Return the number of incident energy values
   */
  long numberIncidentEnergies() const { return this->NE(); }

  /**
   *  @brief Return the subsections, one for each incident energy
   */
  auto distributions() const {

    return this->data_.records();
  }

  /**
   *  @brief Return interpolation type for each range on the incident
   *         energy grid
   */
  auto INT() const { return this->data_.tab2().INT(); }

  /**
   *  @brief Return interpolation type for each range on the incident
   *         energy grid
   */
  auto interpolants() const { return this->INT(); }

  /**
   *  @brief Return interpolation boundaries for the incident energy grid
   */
  auto NBT() const { return this->data_.tab2().NBT(); }

  /**
   *  @brief Return interpolation boundaries for the incident energy grid
   */
  auto boundaries() const { return this->NBT(); }

  /**
   *  @brief Return the incident energy values
   */
  auto E() const {

    return this->distributions()
               | ranges::cpp20::views::transform(
                  [] ( const auto& variant )
                     { return std::visit( [] ( const auto& record )
                                             { return record.incidentEnergy(); },
                                          variant ); } );
  }

  /**
  *  @brief Return the incident energy values
   */
  auto incidentEnergies() const { return this->E(); }

  /**
   *  @brief Return the number of lines in this MF6 component
   */
  long NC() const { return this->data_.NC(); }

  #include "ENDFtk/section/6/ContinuumEnergyAngle/src/print.hpp"
}